

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclDnsize.c
# Opt level: O1

void Abc_SclFindWindow(Abc_Obj_t *pPivot,Vec_Int_t **pvNodes,Vec_Int_t **pvEvals)

{
  byte *pbVar1;
  Abc_Ntk_t *pAVar2;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  void *pvVar3;
  long *plVar4;
  long lVar5;
  int *piVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  
  if ((*(uint *)&pPivot->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pPivot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclDnsize.c"
                  ,0x34,"void Abc_SclFindWindow(Abc_Obj_t *, Vec_Int_t **, Vec_Int_t **)");
  }
  pAVar2 = pPivot->pNtk;
  p = *pvNodes;
  p_00 = *pvEvals;
  p->nSize = 0;
  if (0 < (pPivot->vFanins).nSize) {
    lVar9 = 0;
    do {
      pvVar3 = pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar9]];
      uVar8 = *(uint *)((long)pvVar3 + 0x14) & 0xf;
      if (((uVar8 == 2) || (uVar8 == 5)) || (0 < *(int *)((long)pvVar3 + 0x1c))) {
        Vec_IntPush(p,*(int *)((long)pvVar3 + 0x10));
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (pPivot->vFanins).nSize);
  }
  Vec_IntPush(p,pPivot->Id);
  if (0 < (pPivot->vFanouts).nSize) {
    lVar9 = 0;
    do {
      plVar4 = (long *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanouts).pArray[lVar9]];
      if (((*(uint *)((long)plVar4 + 0x14) & 0xf) == 7) &&
         (Vec_IntPush(p,(int)plVar4[2]), 0 < *(int *)((long)plVar4 + 0x2c))) {
        lVar10 = 0;
        do {
          lVar5 = *(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                           (long)*(int *)(plVar4[6] + lVar10 * 4) * 8);
          if ((*(uint *)(lVar5 + 0x14) & 0xf) == 7) {
            Vec_IntPush(p,*(int *)(lVar5 + 0x10));
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < *(int *)((long)plVar4 + 0x2c));
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (pPivot->vFanouts).nSize);
  }
  if (1 < (long)p->nSize) {
    qsort(p->pArray,(long)p->nSize,4,Vec_IntSortCompare1);
    iVar7 = 1;
    if (1 < p->nSize) {
      piVar6 = p->pArray;
      lVar9 = 1;
      do {
        if (piVar6[lVar9] != piVar6[lVar9 + -1]) {
          lVar10 = (long)iVar7;
          iVar7 = iVar7 + 1;
          piVar6[lVar10] = piVar6[lVar9];
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < p->nSize);
    }
    p->nSize = iVar7;
  }
  if (0 < p->nSize) {
    lVar9 = 0;
    do {
      iVar7 = p->pArray[lVar9];
      if (((long)iVar7 < 0) || (pAVar2->vObjs->nSize <= iVar7)) goto LAB_0045e8b0;
      pvVar3 = pAVar2->vObjs->pArray[iVar7];
      if (pvVar3 != (void *)0x0) {
        if ((*(uint *)((long)pvVar3 + 0x14) & 0x20) != 0) {
          __assert_fail("pObj->fMarkB == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclDnsize.c"
                        ,0x48,"void Abc_SclFindWindow(Abc_Obj_t *, Vec_Int_t **, Vec_Int_t **)");
        }
        *(uint *)((long)pvVar3 + 0x14) = *(uint *)((long)pvVar3 + 0x14) | 0x20;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < p->nSize);
  }
  p_00->nSize = 0;
  if (0 < p->nSize) {
    lVar9 = 0;
    do {
      iVar7 = p->pArray[lVar9];
      if (((long)iVar7 < 0) || (pAVar2->vObjs->nSize <= iVar7)) goto LAB_0045e8b0;
      plVar4 = (long *)pAVar2->vObjs->pArray[iVar7];
      if ((plVar4 != (long *)0x0) && (0 < (long)*(int *)((long)plVar4 + 0x2c))) {
        lVar10 = 0;
        do {
          if ((*(byte *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                  (long)*(int *)(plVar4[6] + lVar10 * 4) * 8) + 0x14) & 0x20) == 0)
          {
            if ((*(byte *)((long)plVar4 + 0x14) & 0x20) == 0) {
              __assert_fail("pObj->fMarkB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclDnsize.c"
                            ,0x51,"void Abc_SclFindWindow(Abc_Obj_t *, Vec_Int_t **, Vec_Int_t **)")
              ;
            }
            Vec_IntPush(p_00,(int)plVar4[2]);
            break;
          }
          lVar10 = lVar10 + 1;
        } while (*(int *)((long)plVar4 + 0x2c) != lVar10);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < p->nSize);
  }
  if (p_00->nSize < 1) {
    __assert_fail("Vec_IntSize(vEvals) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclDnsize.c"
                  ,0x55,"void Abc_SclFindWindow(Abc_Obj_t *, Vec_Int_t **, Vec_Int_t **)");
  }
  if (0 < p->nSize) {
    lVar9 = 0;
    do {
      iVar7 = p->pArray[lVar9];
      if (((long)iVar7 < 0) || (pAVar2->vObjs->nSize <= iVar7)) {
LAB_0045e8b0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar3 = pAVar2->vObjs->pArray[iVar7];
      if (pvVar3 != (void *)0x0) {
        pbVar1 = (byte *)((long)pvVar3 + 0x14);
        *pbVar1 = *pbVar1 & 0xdf;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < p->nSize);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Find the array of nodes to be updated.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_SclFindWindow( Abc_Obj_t * pPivot, Vec_Int_t ** pvNodes, Vec_Int_t ** pvEvals )
{
    Abc_Ntk_t * p = Abc_ObjNtk(pPivot);
    Abc_Obj_t * pObj, * pNext, * pNext2;
    Vec_Int_t * vNodes = *pvNodes;
    Vec_Int_t * vEvals = *pvEvals;
    int i, k;
    assert( Abc_ObjIsNode(pPivot) );
    // collect fanins, node, and fanouts
    Vec_IntClear( vNodes );
    Abc_ObjForEachFanin( pPivot, pNext, i )
//        if ( Abc_ObjIsNode(pNext) && Abc_ObjFaninNum(pNext) > 0 )
        if ( Abc_ObjIsCi(pNext) || Abc_ObjFaninNum(pNext) > 0 )
            Vec_IntPush( vNodes, Abc_ObjId(pNext) );
    Vec_IntPush( vNodes, Abc_ObjId(pPivot) );
    Abc_ObjForEachFanout( pPivot, pNext, i )
        if ( Abc_ObjIsNode(pNext) )
        {
            Vec_IntPush( vNodes, Abc_ObjId(pNext) );
            Abc_ObjForEachFanout( pNext, pNext2, k )
                if ( Abc_ObjIsNode(pNext2) )
                    Vec_IntPush( vNodes, Abc_ObjId(pNext2) );
        }
    Vec_IntUniqify( vNodes );
    // label nodes
    Abc_NtkForEachObjVec( vNodes, p, pObj, i )
    {
        assert( pObj->fMarkB == 0 );
        pObj->fMarkB = 1;
    }
    // collect nodes visible from the critical paths
    Vec_IntClear( vEvals );
    Abc_NtkForEachObjVec( vNodes, p, pObj, i )
        Abc_ObjForEachFanout( pObj, pNext, k )
            if ( !pNext->fMarkB )
            {
                assert( pObj->fMarkB );
                Vec_IntPush( vEvals, Abc_ObjId(pObj) );
                break;
            }
    assert( Vec_IntSize(vEvals) > 0 );
    // label nodes
    Abc_NtkForEachObjVec( vNodes, p, pObj, i )
        pObj->fMarkB = 0;
}